

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O2

FT_ListNode FT_List_Find(FT_List list,void *data)

{
  FT_ListNode pFVar1;
  
  if (list != (FT_List)0x0) {
    while (pFVar1 = list->head, pFVar1 != (FT_ListNode)0x0) {
      if (pFVar1->data == data) {
        return pFVar1;
      }
      list = (FT_List)&pFVar1->next;
    }
  }
  return (FT_ListNode)0x0;
}

Assistant:

FT_EXPORT_DEF( FT_ListNode )
  FT_List_Find( FT_List  list,
                void*    data )
  {
    FT_ListNode  cur;


    if ( !list )
      return NULL;

    cur = list->head;
    while ( cur )
    {
      if ( cur->data == data )
        return cur;

      cur = cur->next;
    }

    return NULL;
  }